

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O3

void sysbvm_jit_sendWithReceiverType
               (sysbvm_bytecodeJit_t *jit,int16_t resultOperand,int16_t receiverTypeOperand,
               int16_t selectorOperand,size_t argumentCount,int16_t *argumentOperands,
               int applicationFlags)

{
  int32_t iVar1;
  void *value;
  undefined6 in_register_0000000a;
  sysbvm_x86_register_t reg;
  undefined6 in_register_00000032;
  long lVar2;
  undefined4 local_40;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  undefined4 local_38;
  undefined4 local_34;
  
  local_38 = (undefined4)CONCAT62(in_register_0000000a,selectorOperand);
  local_34 = (undefined4)CONCAT62(in_register_00000032,resultOperand);
  if (argumentCount != 0xffffffffffffffff) {
    lVar2 = 0;
    do {
      sysbvm_jit_moveOperandToCallArgumentVector(jit,argumentOperands[lVar2],(int32_t)lVar2);
      lVar2 = lVar2 + 1;
    } while (argumentCount + 1 != lVar2);
  }
  iVar1 = jit->contextPointerOffset;
  local_40 = CONCAT13((char)iVar1,0xbd8b48);
  local_3c = (undefined1)((uint)iVar1 >> 8);
  local_3b = (undefined1)((uint)iVar1 >> 0x10);
  local_3a = (undefined1)((uint)iVar1 >> 0x18);
  sysbvm_bytecodeJit_addBytes(jit,7,(uint8_t *)&local_40);
  value = sysbvm_chunkedAllocator_allocate(&(jit->context->heap).picTableAllocator,0x68,8);
  sysbvm_jit_x86_mov64Absolute(jit,SYSBVM_X86_64_ARG1,(uint64_t)value);
  sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG2,receiverTypeOperand);
  sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG3,(int16_t)local_38);
  local_40 = CONCAT13((char)argumentCount,0xc0c749);
  local_3c = (undefined1)(argumentCount >> 8);
  local_3b = (undefined1)(argumentCount >> 0x10);
  local_3a = (undefined1)(argumentCount >> 0x18);
  sysbvm_bytecodeJit_addBytes(jit,7,(uint8_t *)&local_40);
  iVar1 = jit->callArgumentVectorOffset;
  local_40 = CONCAT13((char)iVar1,0x8d8d4c);
  local_3c = (undefined1)((uint)iVar1 >> 8);
  local_3b = (undefined1)((uint)iVar1 >> 0x10);
  local_3a = (undefined1)((uint)iVar1 >> 0x18);
  sysbvm_bytecodeJit_addBytes(jit,7,(uint8_t *)&local_40);
  local_40 = 0x2404c748;
  local_3c = (undefined1)applicationFlags;
  local_3b = (undefined1)((uint)applicationFlags >> 8);
  local_3a = (undefined1)((uint)applicationFlags >> 0x10);
  local_39 = (undefined1)((uint)applicationFlags >> 0x18);
  sysbvm_bytecodeJit_addBytes(jit,8,(uint8_t *)&local_40);
  sysbvm_jit_x86_call(jit,sysbvm_bytecodeInterpreter_interpretSendWithReceiverTypeNoCopyArguments);
  sysbvm_jit_moveRegisterToOperand(jit,(int16_t)local_34,reg);
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_sendWithReceiverType(sysbvm_bytecodeJit_t *jit, int16_t resultOperand, int16_t receiverTypeOperand, int16_t selectorOperand, size_t argumentCount, int16_t *argumentOperands, int applicationFlags)
{
    // Push all of the arguments in the stack.
    for(size_t i = 0; i < argumentCount + 1; ++i)
        sysbvm_jit_moveOperandToCallArgumentVector(jit, argumentOperands[i], (int32_t)i);

    sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);

    sysbvm_pic_t *pic = (sysbvm_pic_t*)sysbvm_chunkedAllocator_allocate(&jit->context->heap.picTableAllocator, sizeof(sysbvm_pic_t), sizeof(uintptr_t));
    sysbvm_jit_x86_mov64Absolute(jit, SYSBVM_X86_64_ARG1, (uint64_t)pic);

    sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG2, receiverTypeOperand);

    sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG3, selectorOperand);
#ifdef _WIN32
    sysbvm_jit_x86_movS32IntoMemoryWithOffset(jit, SYSBVM_X86_RSP, 4*sizeof(void*), (int32_t)argumentCount);

    sysbvm_jit_x86_leaRegisterWithOffset(jit, SYSBVM_X86_RAX, SYSBVM_X86_RBP, jit->callArgumentVectorOffset);
    sysbvm_jit_x86_mov64IntoMemoryWithOffset(jit, SYSBVM_X86_RSP, 5*sizeof(void*), SYSBVM_X86_RAX);

    sysbvm_jit_x86_movS32IntoMemoryWithOffset(jit, SYSBVM_X86_RSP, 6*sizeof(void*), applicationFlags);
#else
    sysbvm_jit_x86_movImmediate32(jit, SYSBVM_X86_SYSV_ARG4, (int32_t)argumentCount);

    sysbvm_jit_x86_leaRegisterWithOffset(jit, SYSBVM_X86_SYSV_ARG5, SYSBVM_X86_RBP, jit->callArgumentVectorOffset);

    sysbvm_jit_x86_movS32IntoMemoryWithOffset(jit, SYSBVM_X86_RSP, 0*sizeof(void*), applicationFlags);
#endif
    sysbvm_jit_x86_call(jit, &sysbvm_bytecodeInterpreter_interpretSendWithReceiverTypeNoCopyArguments);

    sysbvm_jit_moveRegisterToOperand(jit, resultOperand, SYSBVM_X86_RAX);
}